

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

VRStringArray * __thiscall
MinVR::VRDatum::getValueStringArray_abi_cxx11_(VRStringArray *__return_storage_ptr__,VRDatum *this)

{
  VRError *this_00;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  int local_bc;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"This datum is not a VRStringArray.",&local_bd);
  std::operator+(&local_78,"It is a ",&this->description);
  std::operator+(&local_58,&local_78,".");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatum.h",
             &local_be);
  local_bc = 0x113;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"virtual VRStringArray MinVR::VRDatum::getValueStringArray() const"
             ,&local_bf);
  VRError::VRError(this_00,&local_38,&local_58,&local_98,&local_bc,&local_b8);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

virtual VRStringArray getValueStringArray() const {
    VRERROR("This datum is not a VRStringArray.", "It is a " + description + ".");
  }